

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

Node * __thiscall Node::OutputArrayParam_abi_cxx11_(Node *this,int Increment)

{
  int iVar1;
  char *__nptr;
  int in_EDX;
  undefined4 in_register_00000034;
  Node *this_00;
  undefined1 local_e8 [32];
  undefined1 local_c8 [64];
  char local_88 [8];
  char buffer [16];
  undefined1 local_70 [48];
  undefined1 local_40 [44];
  int Increment_local;
  Node *this_local;
  string *result;
  
  this_00 = (Node *)CONCAT44(in_register_00000034,Increment);
  local_40[0x23] = 0;
  local_40._36_4_ = in_EDX;
  unique0x100002f1 = this_00;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  if (this_00->Type == 0x1f5) {
    if (this_00->Tree[0] == (Node *)0x0) {
      std::__cxx11::string::operator=((string *)this,"(NULL)");
    }
    else {
      OutputArrayParam_abi_cxx11_((Node *)local_40,(int)this_00->Tree[0]);
      std::__cxx11::string::operator=((string *)this,(string *)local_40);
      std::__cxx11::string::~string((string *)local_40);
    }
    std::__cxx11::string::operator+=((string *)this,"][");
    if (this_00->Tree[1] == (Node *)0x0) {
      std::__cxx11::string::operator+=((string *)this,"(NULL)");
    }
    else {
      OutputArrayParam_abi_cxx11_((Node *)local_70,(int)this_00->Tree[1]);
      std::__cxx11::string::operator+=((string *)this,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  else if (local_40._36_4_ == 1) {
    iVar1 = IsSimpleInteger(this_00);
    if (iVar1 == 0) {
      OutputForcedType_abi_cxx11_((Node *)local_c8,Increment);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_c8 + 0x20),local_c8);
      std::__cxx11::string::operator=((string *)this,(string *)(local_c8 + 0x20));
      std::__cxx11::string::~string((string *)(local_c8 + 0x20));
      std::__cxx11::string::~string((string *)local_c8);
    }
    else {
      __nptr = (char *)std::__cxx11::string::c_str();
      iVar1 = atoi(__nptr);
      sprintf(local_88,"%d",(ulong)(iVar1 + 1));
      std::__cxx11::string::operator=((string *)this,local_88);
    }
  }
  else {
    OutputForcedType_abi_cxx11_((Node *)local_e8,Increment);
    std::__cxx11::string::operator=((string *)this,(string *)local_e8);
    std::__cxx11::string::~string((string *)local_e8);
  }
  return this;
}

Assistant:

std::string Node::OutputArrayParam(
	int Increment	/**< Increment */
)
{
	std::string result;

	switch(Type)
	{
	case BAS_N_LIST:

		if (Tree[0] != 0)
		{
			result = Tree[0]->OutputArrayParam(Increment);
		}
		else
		{
			result = "(NULL)";
		}
		result += "][";
		if (Tree[1] != 0)
		{
			result += Tree[1]->OutputArrayParam(Increment);
		}
		else
		{
			result += "(NULL)";
		}
		break;

	default:

		if (Increment == 1)
		{
			if (IsSimpleInteger())
			{
				// FIXME: There really ought to be a better way
				char buffer[16];
				sprintf(buffer, "%d", atoi(TextValue.c_str()) + 1);
				result = buffer;
			}
			else
			{
				result = OutputForcedType(VARTYPE_INTEGER) + " + 1";
			}
		}
		else
		{
			result = OutputForcedType(VARTYPE_INTEGER);
		}
		break;

	}
	return result;
}